

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subqueryref.cpp
# Opt level: O2

string * __thiscall
duckdb::SubqueryRef::ToString_abi_cxx11_(string *__return_storage_ptr__,SubqueryRef *this)

{
  pointer pSVar1;
  string result;
  string sStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pSVar1 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>::
           operator->(&this->subquery);
  (*(pSVar1->super_SQLStatement)._vptr_SQLStatement[2])(&local_38,pSVar1);
  ::std::operator+(&local_78,"(",&local_38);
  ::std::operator+(&local_58,&local_78,")");
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::string((string *)&sStack_98,(string *)&local_58);
  TableRef::BaseToString
            (__return_storage_ptr__,&this->super_TableRef,&sStack_98,
             &(this->super_TableRef).column_name_alias);
  ::std::__cxx11::string::~string((string *)&sStack_98);
  ::std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

string SubqueryRef::ToString() const {
	string result = "(" + subquery->ToString() + ")";
	return BaseToString(result, column_name_alias);
}